

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

UInt64 __thiscall Json::Value::asUInt64(Value *this)

{
  double dVar1;
  bool bVar2;
  UInt64 UVar3;
  runtime_error *this_00;
  
  UVar3 = (UInt64)(byte)this->field_0x8;
  switch(UVar3) {
  case 0:
    break;
  case 1:
    bVar2 = isUInt64(this);
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"LargestInt out of UInt64 range");
      goto LAB_00140f12;
    }
  case 2:
    UVar3 = (this->value_).int_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < 0.0) || (1.8446744073709552e+19 < dVar1)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"double out of UInt64 range");
      goto LAB_00140f12;
    }
    UVar3 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to UInt64.");
LAB_00140f12:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    UVar3 = (UInt64)(this->value_).bool_;
  }
  return UVar3;
}

Assistant:

Value::UInt64
Value::asUInt64() const
{
   switch ( type_ )
   {
   case intValue:
      JSON_ASSERT_MESSAGE(isUInt64(), "LargestInt out of UInt64 range");
      return UInt64(value_.int_);
   case uintValue:
      return UInt64(value_.uint_);
   case realValue:
      JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt64), "double out of UInt64 range");
      return UInt64( value_.real_ );
   case nullValue:
      return 0;
   case booleanValue:
      return value_.bool_ ? 1 : 0;
   default:
      break;
   }
   JSON_FAIL_MESSAGE("Value is not convertible to UInt64.");
}